

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Observed_Base.cpp
# Opt level: O2

uint8_t * __thiscall
SRUP_MSG_OBS_BASE::encrypted_data(SRUP_MSG_OBS_BASE *this,bool key_string,char *key)

{
  char *pcVar1;
  uint8_t *puVar2;
  undefined7 in_register_00000031;
  
  pcVar1 = SRUP_Crypto::crypt(this->m_crypto,(char *)CONCAT71(in_register_00000031,key_string),key);
  if (pcVar1 == (char *)0x0) {
    return (uint8_t *)0x0;
  }
  if (key_string) {
    puVar2 = SRUP_Crypto::Decrypt(this->m_crypto,key);
    return puVar2;
  }
  puVar2 = SRUP_Crypto::DecryptF(this->m_crypto,key);
  return puVar2;
}

Assistant:

const uint8_t *SRUP_MSG_OBS_BASE::encrypted_data(bool key_string, char* key)
{
    if (m_crypto->crypt() != nullptr)
    {
        if (key_string)
            return m_crypto->Decrypt(key);
        else
            return m_crypto->DecryptF(key);
    }
    else
        return nullptr;
}